

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_alphargbblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uint *src,int mapWidth,
               int mapHeight,int srcStride,QClipData *clip,bool useGammaCorrection)

{
  long lVar1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  QRgba64 *pQVar7;
  int *b;
  int *piVar8;
  QRgba64 *in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  long in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  uint coverage_1;
  int xp;
  QRgba64 *dest_1;
  int end;
  int start;
  QT_FT_Span *clip_1;
  byte in_stack_00000020;
  int i_1;
  ClipLine *line;
  int yp;
  int top;
  int bottom;
  uint coverage;
  int j;
  QRgba64 *dest;
  int l;
  int i;
  int ly;
  DestStoreProc64 destStore64;
  DestFetchProc64 destFetch64;
  QColorTrcLut *colorProfile;
  int length;
  QRgba64 srcColor;
  QRgba64 buffer [2048];
  undefined4 in_stack_ffffffffffffbf28;
  undefined4 in_stack_ffffffffffffbf2c;
  QColorTrcLut *in_stack_ffffffffffffbf30;
  undefined4 in_stack_ffffffffffffbf38;
  int iVar9;
  undefined4 in_stack_ffffffffffffbf3c;
  int iVar10;
  undefined8 in_stack_ffffffffffffbf40;
  undefined4 in_stack_ffffffffffffbf48;
  undefined4 in_stack_ffffffffffffbf4c;
  int iVar11;
  undefined8 in_stack_ffffffffffffbf50;
  int local_40a4;
  int local_4094;
  undefined4 in_stack_ffffffffffffbf80;
  undefined4 in_stack_ffffffffffffbf84;
  int iVar12;
  QColorTrcLut *local_4068;
  long local_4058;
  int local_4040;
  int local_403c [3];
  int local_4030;
  int local_402c;
  quint64 local_4028;
  quint64 local_4020;
  quint64 local_4018;
  int local_4010;
  int local_400c;
  QRgba64 local_4008 [12];
  QRgba64 in_stack_ffffffffffffc058;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_4010 = in_EDX;
  local_400c = in_ESI;
  bVar4 = QRgba64::isTransparent(in_RCX);
  if (!bVar4) {
    local_4068 = (QColorTrcLut *)0x0;
    if ((in_stack_00000020 & 1) != 0) {
      QGuiApplicationPrivate::instance();
      local_4068 = QGuiApplicationPrivate::colorProfileForA32Text
                             ((QGuiApplicationPrivate *)
                              CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38));
    }
    local_4018 = in_RCX->rgba;
    if ((local_4068 != (QColorTrcLut *)0x0) && (bVar4 = QRgba64::isOpaque(in_RCX), bVar4)) {
      local_4028 = local_4018;
      local_4020 = (quint64)QColorTrcLut::toLinear
                                      (in_stack_ffffffffffffbf30,in_stack_ffffffffffffc058);
      local_4018 = local_4020;
    }
    p_Var2 = destFetchProc64[in_RDI->format];
    p_Var3 = destStoreProc64[in_RDI->format];
    if (clip_1 == (QT_FT_Span *)0x0) {
      for (iVar12 = 0; iVar11 = local_400c, iVar5 = in_R9D, iVar12 < (int)dest_1;
          iVar12 = iVar12 + 1) {
        for (; local_402c = iVar5, 0 < local_402c; iVar5 = local_402c - iVar5) {
          piVar6 = qMin<int>(&BufferSize,&local_402c);
          iVar5 = *piVar6;
          pQVar7 = (*p_Var2)(local_4008,in_RDI,iVar11,local_4010 + iVar12,iVar5);
          for (local_4094 = 0; local_4094 < iVar5; local_4094 = local_4094 + 1) {
            alphargbblend_generic
                      ((uint)((ulong)in_stack_ffffffffffffbf50 >> 0x20),
                       (QRgba64 *)CONCAT44(in_stack_ffffffffffffbf4c,in_stack_ffffffffffffbf48),
                       (int)((ulong)in_stack_ffffffffffffbf40 >> 0x20),
                       (QRgba64 *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
                       (QRgba64 *)in_stack_ffffffffffffbf30,
                       (QColorTrcLut *)CONCAT44(in_stack_ffffffffffffbf2c,in_stack_ffffffffffffbf28)
                      );
          }
          if (p_Var3 != (DestStoreProc64)0x0) {
            (*p_Var3)(in_RDI,iVar11,local_4010 + iVar12,pQVar7,iVar5);
          }
          iVar11 = iVar5 + iVar11;
        }
      }
    }
    else {
      local_4030 = local_4010 + (int)dest_1;
      local_403c[2] = QRasterBuffer::height(in_RDI);
      piVar6 = qMin<int>(&local_4030,local_403c + 2);
      iVar12 = *piVar6;
      local_403c[1] = 0;
      piVar6 = qMax<int>(&local_4010,local_403c + 1);
      local_40a4 = *piVar6;
      local_4058 = in_R8 + (long)((local_40a4 - local_4010) * end) * 4;
      QClipData::initialize
                ((QClipData *)CONCAT44(in_stack_ffffffffffffbf84,in_stack_ffffffffffffbf80));
      for (; local_40a4 < iVar12; local_40a4 = local_40a4 + 1) {
        piVar6 = (int *)(*(long *)&clip_1->y + (long)local_40a4 * 0x10);
        for (iVar11 = 0; iVar11 < *piVar6; iVar11 = iVar11 + 1) {
          b = (int *)(*(long *)(piVar6 + 2) + (long)iVar11 * 0x10);
          piVar8 = qMax<int>(&local_400c,b);
          iVar5 = *piVar8;
          local_403c[0] = local_400c + in_R9D;
          local_4040 = *b + b[1];
          piVar8 = qMin<int>(local_403c,&local_4040);
          iVar9 = *piVar8;
          if (iVar5 < iVar9) {
            pQVar7 = (*p_Var2)(local_4008,in_RDI,iVar5,b[2],iVar9 - iVar5);
            iVar10 = iVar5;
            for (; iVar5 < iVar9; iVar5 = iVar5 + 1) {
              alphargbblend_generic
                        ((uint)((ulong)piVar6 >> 0x20),
                         (QRgba64 *)CONCAT44(iVar11,in_stack_ffffffffffffbf48),
                         (int)((ulong)b >> 0x20),(QRgba64 *)CONCAT44(iVar10,iVar9),pQVar7,
                         (QColorTrcLut *)
                         CONCAT44(iVar5,*(undefined4 *)(local_4058 + (long)(iVar5 - local_400c) * 4)
                                 ));
            }
            if (p_Var3 != (DestStoreProc64)0x0) {
              (*p_Var3)(in_RDI,iVar10,b[2],pQVar7,iVar9 - iVar10);
            }
          }
        }
        local_4058 = local_4058 + (long)end * 4;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphargbblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uint *src, int mapWidth, int mapHeight, int srcStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA32Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                for (int j=0; j < l; ++j) {
                    const uint coverage = src[j + (i - x)];
                    alphargbblend_generic(coverage, dest, j, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            src += srcStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        src += (top - y) * srcStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);

                for (int xp=start; xp<end; ++xp) {
                    const uint coverage = src[xp - x];
                    alphargbblend_generic(coverage, dest, xp - start, srcColor, color, colorProfile);
                }
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            src += srcStride;
        } // for (yp -> bottom)
    }
}